

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall
cmMakefile::AddCacheDefinition
          (cmMakefile *this,string *name,char *value,char *doc,CacheEntryType type,bool force)

{
  size_type sVar1;
  CacheEntryType CVar2;
  size_t sVar3;
  char *pcVar4;
  _Alloc_hider value_00;
  ulong uVar5;
  cmState *this_00;
  undefined4 in_register_00000084;
  long lVar6;
  bool bVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string val;
  string nvalue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  undefined8 local_a0;
  string local_98;
  char *local_78;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  local_a0 = CONCAT44(in_register_00000084,type);
  bVar7 = value != (char *)0x0;
  pcVar4 = "";
  if (bVar7) {
    pcVar4 = value;
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_78 = doc;
  sVar3 = strlen(pcVar4);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,pcVar4,pcVar4 + sVar3);
  pcVar4 = cmState::GetInitializedCacheValue
                     (this->LocalGenerator->GlobalGenerator->CMakeInstance->State,name);
  if ((pcVar4 != (char *)0x0) &&
     (CVar2 = cmState::GetCacheEntryType
                        (this->LocalGenerator->GlobalGenerator->CMakeInstance->State,name),
     sVar1 = local_98._M_string_length, CVar2 == UNINITIALIZED)) {
    if (!force) {
      strlen(pcVar4);
      std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)sVar1,(ulong)pcVar4);
    }
    bVar7 = !force || bVar7;
    if ((int)local_a0 - 1U < 2) {
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
      cmSystemTools::ExpandListArgument(&local_98,&local_b8,false);
      if (local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar6 = 0;
        uVar5 = 0;
        do {
          bVar7 = cmSystemTools::IsOff
                            (*(char **)((long)&((local_b8.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + lVar6));
          if (!bVar7) {
            cmsys::SystemTools::CollapseFullPath
                      (&local_50,
                       (string *)
                       ((long)&((local_b8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar6));
            std::__cxx11::string::operator=
                      ((string *)
                       ((long)&((local_b8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar6),(string *)&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          if (uVar5 != 0) {
            std::__cxx11::string::append((char *)local_70);
          }
          std::__cxx11::string::_M_append
                    ((char *)local_70,
                     *(ulong *)((long)&((local_b8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar6));
          uVar5 = uVar5 + 1;
          lVar6 = lVar6 + 0x20;
        } while (uVar5 < (ulong)((long)local_b8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_b8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      cmState::AddCacheEntry
                (this->LocalGenerator->GlobalGenerator->CMakeInstance->State,name,
                 (char *)local_70[0],local_78,(CacheEntryType)local_a0);
      pcVar4 = cmState::GetInitializedCacheValue
                         (this->LocalGenerator->GlobalGenerator->CMakeInstance->State,name);
      strlen(pcVar4);
      std::__cxx11::string::_M_replace
                ((ulong)&local_98,0,(char *)local_98._M_string_length,(ulong)pcVar4);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b8);
      this_00 = this->LocalGenerator->GlobalGenerator->CMakeInstance->State;
      value_00._M_p = local_98._M_dataplus._M_p;
      goto LAB_002d2c29;
    }
  }
  this_00 = this->LocalGenerator->GlobalGenerator->CMakeInstance->State;
  value_00._M_p = local_98._M_dataplus._M_p;
  if (!bVar7) {
    value_00._M_p =
         (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
  }
LAB_002d2c29:
  cmState::AddCacheEntry(this_00,name,value_00._M_p,local_78,(CacheEntryType)local_a0);
  cmDefinitions::Set((cmDefinitions *)
                     ((((this->Internal).x_)->VarStack).
                      super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                      _M_node.super__List_node_base._M_prev + 1),name,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefile::AddCacheDefinition(const std::string& name, const char* value,
                                    const char* doc,
                                    cmState::CacheEntryType type,
                                    bool force)
{
  bool haveVal = value ? true : false;
  std::string val = haveVal ? value : "";
  const char* existingValue =
    this->GetState()->GetInitializedCacheValue(name);
  if(existingValue
      && (this->GetState()->GetCacheEntryType(name)
                                            == cmState::UNINITIALIZED))
    {
    // if this is not a force, then use the value from the cache
    // if it is a force, then use the value being passed in
    if(!force)
      {
      val = existingValue;
      haveVal = true;
      }
    if ( type == cmState::PATH || type == cmState::FILEPATH )
      {
      std::vector<std::string>::size_type cc;
      std::vector<std::string> files;
      std::string nvalue = "";
      cmSystemTools::ExpandListArgument(val, files);
      for ( cc = 0; cc < files.size(); cc ++ )
        {
        if(!cmSystemTools::IsOff(files[cc].c_str()))
          {
          files[cc] = cmSystemTools::CollapseFullPath(files[cc]);
          }
        if ( cc > 0 )
          {
          nvalue += ";";
          }
        nvalue += files[cc];
        }

      this->GetState()->AddCacheEntry(name, nvalue.c_str(), doc, type);
      val = this->GetState()->GetInitializedCacheValue(name);
      haveVal = true;
      }

    }
  this->GetState()->AddCacheEntry(name, haveVal ? val.c_str() : 0,
                                          doc, type);
  // if there was a definition then remove it
  this->Internal->RemoveDefinition(name);
}